

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Return_Button.cxx
# Opt level: O0

int __thiscall Fl_Return_Button::handle(Fl_Return_Button *this,int event)

{
  int iVar1;
  int event_local;
  Fl_Return_Button *this_local;
  
  if (event == 0xc) {
    iVar1 = Fl::event_key();
    if (iVar1 != 0xff0d) {
      iVar1 = Fl::event_key();
      if (iVar1 != 0xff8d) goto LAB_0020d940;
    }
    Fl_Button::simulate_key_action(&this->super_Fl_Button);
    Fl_Widget::do_callback((Fl_Widget *)this);
    this_local._4_4_ = 1;
  }
  else {
LAB_0020d940:
    this_local._4_4_ = Fl_Button::handle(&this->super_Fl_Button,event);
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Return_Button::handle(int event) {
  if (event == FL_SHORTCUT &&
      (Fl::event_key() == FL_Enter || Fl::event_key() == FL_KP_Enter)) {
    simulate_key_action();
    do_callback();
    return 1;
  } else
    return Fl_Button::handle(event);
}